

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018a7fd8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018a74c0,DestMesh,&cp->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018a71c0;
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
  super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018a7900
  ;
  iVar1 = (cp->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
          [1];
  iVar2 = (cp->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
          [2];
  iVar3 = (cp->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
          [3];
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0]
  ;
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1] =
       iVar1;
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2] =
       iVar2;
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3] =
       iVar3;
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
  super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZQuadSphere_018a7030;
  (this->fGeo).fR = (cp->fGeo).fR;
  TPZVec<double>::TPZVec(&(this->fGeo).fxc,&(cp->fGeo).fxc);
  lVar4 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar4) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar4) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar4) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xd8);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar4) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar4);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar4) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar4);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xd8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}